

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O0

bool spdlog::details::os::is_color_terminal(void)

{
  int iVar1;
  char *pcVar2;
  anon_class_8_1_a7dcfcbe_for__M_pred __pred;
  const_iterator __first;
  char *env_p;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  bool local_1;
  
  pcVar2 = getenv("TERM");
  if (pcVar2 == (char *)0x0) {
    local_1 = false;
  }
  else {
    if (is_color_terminal()::result == '\0') {
      iVar1 = __cxa_guard_acquire(&is_color_terminal()::result);
      if (iVar1 != 0) {
        __pred.env_p = std::begin<std::array<char_const*,14ul>>
                                 ((array<const_char_*,_14UL> *)0x22f1cd);
        __first = std::end<std::array<char_const*,14ul>>((array<const_char_*,_14UL> *)0x22f1e0);
        is_color_terminal::result =
             std::any_of<char_const*const*,spdlog::details::os::is_color_terminal()::__0>
                       (__first,(char **)CONCAT17(in_stack_ffffffffffffffd7,
                                                  in_stack_ffffffffffffffd0),__pred);
        __cxa_guard_release(&is_color_terminal()::result);
      }
    }
    local_1 = (bool)(is_color_terminal::result & 1);
  }
  return local_1;
}

Assistant:

SPDLOG_INLINE bool is_color_terminal() SPDLOG_NOEXCEPT
{
#ifdef _WIN32
    return true;
#else
    static constexpr std::array<const char *, 14> Terms = {
        {"ansi", "color", "console", "cygwin", "gnome", "konsole", "kterm", "linux", "msys", "putty", "rxvt", "screen", "vt100", "xterm"}};

    const char *env_p = std::getenv("TERM");
    if (env_p == nullptr)
    {
        return false;
    }

    static const bool result =
        std::any_of(std::begin(Terms), std::end(Terms), [&](const char *term) { return std::strstr(env_p, term) != nullptr; });
    return result;
#endif
}